

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

GLenum __thiscall
polyscope::render::backend_openGL3_glfw::GLTextureBuffer::textureType(GLTextureBuffer *this)

{
  long in_RDI;
  string *in_stack_00000010;
  allocator local_31;
  string local_30 [44];
  GLenum local_4;
  
  if (*(int *)(in_RDI + 8) == 1) {
    local_4 = 0xde0;
  }
  else if (*(int *)(in_RDI + 8) == 2) {
    local_4 = 0xde1;
  }
  else if (*(int *)(in_RDI + 8) == 3) {
    local_4 = 0x806f;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"bad texture type",&local_31);
    exception(in_stack_00000010);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    local_4 = 0xde0;
  }
  return local_4;
}

Assistant:

GLenum GLTextureBuffer::textureType() {
  if (dim == 1) {
    return GL_TEXTURE_1D;
  } else if (dim == 2) {
    return GL_TEXTURE_2D;
  } else if (dim == 3) {
    return GL_TEXTURE_3D;
  }
  exception("bad texture type");
  return GL_TEXTURE_1D;
}